

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O3

ssize_t __thiscall
xmrig::SelfSelectClient::send(SelfSelectClient *this,int __fd,void *__buf,size_t __n,int __flags)

{
  Ch *__n_00;
  ssize_t extraout_RAX;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_88;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_58;
  
  local_58.os_ = &local_88;
  local_88.stack_.stack_ = (char *)0x0;
  local_88.stack_.stackTop_ = (char *)0x0;
  local_88.stack_.allocator_ = (CrtAllocator *)0x0;
  local_88.stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_88.stack_.stackEnd_ = (char *)0x0;
  local_88.stack_.initialCapacity_ = 0x200;
  local_58.level_stack_.allocator_ = (CrtAllocator *)0x0;
  local_58.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_58.level_stack_.stack_ = (char *)0x0;
  local_58.level_stack_.stackTop_ = (char *)0x0;
  local_58.level_stack_.stackEnd_ = (char *)0x0;
  local_58.level_stack_.initialCapacity_ = 0x200;
  local_58.maxDecimalPlaces_ = 0x144;
  local_58.hasRoot_ = false;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)__n,&local_58);
  __n_00 = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                     (&local_88);
  send(this,__fd,__buf,(size_t)__n_00,(int)local_88.stack_.stackTop_ - (int)local_88.stack_.stack_);
  free(local_58.level_stack_.stack_);
  operator_delete(local_58.level_stack_.ownAllocator_);
  free(local_88.stack_.stack_);
  operator_delete(local_88.stack_.ownAllocator_);
  return extraout_RAX;
}

Assistant:

void xmrig::SelfSelectClient::send(int method, const char *url, const rapidjson::Document &doc)
{
    using namespace rapidjson;

    StringBuffer buffer(nullptr, 512);
    Writer<StringBuffer> writer(buffer);
    doc.Accept(writer);

    send(method, url, buffer.GetString(), buffer.GetSize());
}